

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O2

ON_Plane * __thiscall
ON_SubDVertex::VertexFrame
          (ON_Plane *__return_storage_ptr__,ON_SubDVertex *this,
          ON_SubDComponentLocation subd_appearance)

{
  ON_3dVector *v;
  double d;
  bool bVar1;
  uint uVar2;
  ON_SubDFace *sector_face;
  ON_SubDEdge *this_00;
  ON_SubDVertex *this_01;
  ON_SubDFace *this_02;
  long lVar3;
  ON_Plane *pOVar4;
  ON_Plane *pOVar5;
  byte bVar6;
  ON_3dPoint local_180;
  ON_3dVector X;
  ON_3dVector local_150;
  ON_Plane vertex_frame;
  ON_3dVector V;
  double local_a0 [6];
  double local_70 [5];
  ON_3dPoint local_48;
  
  bVar6 = 0;
  uVar2 = FaceCount(this);
  if ((uVar2 == 0) || (sector_face = Face(this,0), sector_face == (ON_SubDFace *)0x0)) {
    pOVar4 = &ON_Plane::NanPlane;
    pOVar5 = __return_storage_ptr__;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pOVar5->origin).x = (pOVar4->origin).x;
      pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    return __return_storage_ptr__;
  }
  pOVar4 = &ON_Plane::NanPlane;
  pOVar5 = &vertex_frame;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar5->origin).x = (pOVar4->origin).x;
    pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  pOVar4 = __return_storage_ptr__;
  if (subd_appearance == ControlNet) {
    V.z = ON_3dVector::ZeroVector.z;
    V.x = ON_3dVector::ZeroVector.x;
    V.y = ON_3dVector::ZeroVector.y;
    for (uVar2 = 0; this_02 = sector_face, uVar2 < this->m_edge_count; uVar2 = uVar2 + 1) {
      this_00 = Edge(this,uVar2);
      if ((((this_00 != (ON_SubDEdge *)0x0) &&
           (this_01 = ON_SubDEdge::OtherEndVertex(this_00,this), this_01 != (ON_SubDVertex *)0x0))
          && (this_00->m_face_count == 1)) &&
         (this_02 = ON_SubDEdge::Face(this_00,0), this_02 != (ON_SubDFace *)0x0)) {
        ControlNetPoint((ON_3dPoint *)&local_150,this_01);
        ControlNetPoint(&local_48,this);
        ON_3dPoint::operator-((ON_3dVector *)&local_180,(ON_3dPoint *)&local_150,&local_48);
        ON_3dVector::UnitVector(&X,(ON_3dVector *)&local_180);
        V.z = X.z;
        V.x = X.x;
        V.y = X.y;
        break;
      }
    }
    ControlNetPoint((ON_3dPoint *)&X,this);
    ON_SubDFace::ControlNetCenterNormal((ON_3dVector *)&local_180,this_02);
    ON_Plane::CreateFromNormal(&vertex_frame,(ON_3dPoint *)&X,(ON_3dVector *)&local_180);
    v = &vertex_frame.zaxis;
    d = ON_3dVector::operator*(&V,v);
    ::operator*(&local_150,d,v);
    ON_3dVector::operator-((ON_3dVector *)&local_180,&V,&local_150);
    ON_3dVector::UnitVector(&X,(ON_3dVector *)&local_180);
    bVar1 = ON_3dVector::IsUnitVector(&X);
    if (bVar1) {
      vertex_frame.xaxis.z = X.z;
      vertex_frame.xaxis.x = X.x;
      vertex_frame.xaxis.y = X.y;
      ON_CrossProduct(&local_150,v,&vertex_frame.xaxis);
      ON_3dVector::UnitVector((ON_3dVector *)&local_180,&local_150);
      vertex_frame.yaxis.z = local_180.z;
      vertex_frame.yaxis.x = local_180.x;
      vertex_frame.yaxis.y = local_180.y;
    }
  }
  else {
    uVar2 = FaceCount(this);
    if ((uVar2 != 0) &&
       (bVar1 = GetSurfacePoint(this,sector_face,(ON_SubDSectorSurfacePoint *)&V), !bVar1)) {
      pOVar5 = &ON_Plane::NanPlane;
      lVar3 = 0x10;
      goto LAB_00603f1c;
    }
    ON_CrossProduct(&X,local_70,local_a0);
    ON_3dVector::Unitize(&X);
    ON_3dPoint::ON_3dPoint(&local_180,&V.x);
    ON_3dVector::ON_3dVector(&local_150,local_70);
    ON_Plane::CreateFromNormal(&vertex_frame,&local_180,&local_150);
    vertex_frame.yaxis.x = X.x;
    vertex_frame.yaxis.y = X.y;
    vertex_frame.yaxis.z = X.z;
    ON_CrossProduct((ON_3dVector *)&local_180,&vertex_frame.yaxis,&vertex_frame.zaxis);
    vertex_frame.xaxis.z = local_180.z;
    vertex_frame.xaxis.x = local_180.x;
    vertex_frame.xaxis.y = local_180.y;
    ON_3dVector::Unitize(&vertex_frame.xaxis);
  }
  pOVar5 = &vertex_frame;
  bVar1 = ON_Plane::IsValid(pOVar5);
  if (!bVar1) {
    pOVar5 = &ON_Plane::NanPlane;
  }
  lVar3 = 0x10;
LAB_00603f1c:
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar4->origin).x = (pOVar5->origin).x;
    pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
    pOVar4 = (ON_Plane *)((long)pOVar4 + (ulong)bVar6 * -0x10 + 8);
  }
  ON_Plane::~ON_Plane(&vertex_frame);
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDVertex::VertexFrame(
  ON_SubDComponentLocation subd_appearance
) const
{
  if (0 == FaceCount())
    return ON_Plane::NanPlane;

  const ON_SubDFace* sector_face = Face(0);
  if (nullptr == sector_face)
    return ON_Plane::NanPlane;

  ON_Plane vertex_frame(ON_Plane::NanPlane);
  if (ON_SubDComponentLocation::ControlNet == subd_appearance)
  {
    ON_3dVector V = ON_3dVector::ZeroVector;
    for (int vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = Edge(vei);
      if (nullptr == e)
        continue;
      const ON_SubDVertex* v1 = e->OtherEndVertex(this);
      if (nullptr == v1)
        continue;
      const ON_SubDFace* f = (1 == e->m_face_count) ? e->Face(0) : nullptr;
      if (nullptr == f)
        continue;
      sector_face = f;
      V = (v1->ControlNetPoint() - ControlNetPoint()).UnitVector();
      break;
    }
    vertex_frame.CreateFromNormal(ControlNetPoint(), sector_face->ControlNetCenterNormal());
    const ON_3dVector X = (V - (V * vertex_frame.zaxis) * vertex_frame.zaxis).UnitVector();
    if (X.IsUnitVector())
    {
      vertex_frame.xaxis = X;
      vertex_frame.yaxis = ON_CrossProduct(vertex_frame.zaxis, vertex_frame.xaxis).UnitVector();
    }
  }
  else
  {
    // If this is a smooth vertex or a crease vertex on the boundary,
    // then the sector_face does not matter. Otherwise it picks the
    // "side of the crease" for the normal.
    ON_SubDSectorSurfacePoint limit_point;
    if (FaceCount())
      if (false == GetSurfacePoint(sector_face, limit_point))
        return ON_Plane::NanPlane;

    ON_3dVector Y(ON_CrossProduct(limit_point.m_limitN, limit_point.m_limitT1));
    Y.Unitize();

    // The normal is more important than the tangent direction. 
    vertex_frame.CreateFromNormal(ON_3dPoint(limit_point.m_limitP), ON_3dVector(limit_point.m_limitN));
    vertex_frame.yaxis = Y;
    vertex_frame.xaxis = ON_CrossProduct(vertex_frame.yaxis, vertex_frame.zaxis);
    vertex_frame.xaxis.Unitize();
  }

  return vertex_frame.IsValid() ? vertex_frame : ON_Plane::NanPlane;
}